

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O1

int __thiscall
cmCPackArchiveGenerator::addOneComponentToArchive
          (cmCPackArchiveGenerator *this,cmArchiveWrite *archive,cmCPackComponent *component,
          Deduplicator *deduplicator)

{
  cmCPackLog *pcVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  DeduplicateStatus DVar5;
  ostream *poVar6;
  size_t sVar7;
  string *psVar8;
  char *__s;
  cmValue cVar9;
  uint uVar10;
  pointer __rhs;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string rp;
  string localToplevel;
  string filePrefix;
  ostringstream cmCPackLog_msg;
  cmWorkingDirectory workdir;
  string local_2b8;
  cmCPackArchiveGenerator *local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  _func_int *local_270;
  undefined8 local_268;
  cmArchiveWrite *local_260;
  string local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string local_218;
  pointer local_1f8;
  string local_1f0;
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [96];
  ios_base local_160 [264];
  cmWorkingDirectory local_58;
  
  local_298 = this;
  local_260 = archive;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d0,"   - packaging component: ",0x1a);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1d0,(component->Name)._M_dataplus._M_p,
                      (component->Name)._M_string_length);
  std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  pcVar1 = (local_298->super_cmCPackGenerator).Logger;
  std::__cxx11::stringbuf::str();
  _Var3._M_p = local_290._M_dataplus._M_p;
  sVar7 = strlen(local_290._M_dataplus._M_p);
  cmCPackLog::Log(pcVar1,2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                  ,0xea,_Var3._M_p,sVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
  std::ios_base::~ios_base(local_160);
  local_1d0._0_8_ = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1d0,"CPACK_TEMPORARY_DIRECTORY","");
  psVar8 = (string *)
           cmCPackGenerator::GetOption(&local_298->super_cmCPackGenerator,(string *)local_1d0);
  if (psVar8 == (string *)0x0) {
    psVar8 = &cmValue::Empty_abi_cxx11_;
  }
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  pcVar2 = (psVar8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,pcVar2,pcVar2 + psVar8->_M_string_length);
  if ((undefined1 *)local_1d0._0_8_ != local_1c0) {
    operator_delete((void *)local_1d0._0_8_,(ulong)(local_1c0._0_8_ + 1));
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,"/",
                 &component->Name);
  std::__cxx11::string::_M_append((char *)&local_258,local_1d0._0_8_);
  if ((undefined1 *)local_1d0._0_8_ != local_1c0) {
    operator_delete((void *)local_1d0._0_8_,(ulong)(local_1c0._0_8_ + 1));
  }
  cmWorkingDirectory::cmWorkingDirectory(&local_58,&local_258);
  if (local_58.ResultCode == 0) {
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    local_238._M_string_length = 0;
    local_238.field_2._M_local_buf[0] = '\0';
    local_1d0._0_8_ = local_1c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d0,"CPACK_COMPONENT_INCLUDE_TOPLEVEL_DIRECTORY","");
    bVar4 = cmCPackGenerator::IsOn(&local_298->super_cmCPackGenerator,(string *)local_1d0);
    if ((undefined1 *)local_1d0._0_8_ != local_1c0) {
      operator_delete((void *)local_1d0._0_8_,(ulong)(local_1c0._0_8_ + 1));
    }
    if (bVar4) {
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f0,"CPACK_PACKAGE_FILE_NAME","");
      psVar8 = (string *)cmCPackGenerator::GetOption(&local_298->super_cmCPackGenerator,&local_1f0);
      if (psVar8 == (string *)0x0) {
        psVar8 = &cmValue::Empty_abi_cxx11_;
      }
      local_290._M_string_length = (size_type)(psVar8->_M_dataplus)._M_p;
      local_290._M_dataplus._M_p = (pointer)psVar8->_M_string_length;
      local_290.field_2._M_allocated_capacity = 0;
      local_270 = (_func_int *)(local_1c0 + 8);
      local_1d0._0_8_ = (_func_int **)0x0;
      local_1d0._8_8_ = 1;
      local_1c0[8] = '/';
      local_290.field_2._8_8_ = 1;
      local_268 = 0;
      views._M_len = 2;
      views._M_array = (iterator)&local_290;
      local_1c0._0_8_ = local_270;
      cmCatViews(&local_2b8,views);
      std::__cxx11::string::operator=((string *)&local_238,(string *)&local_2b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
    }
    local_1d0._0_8_ = local_1c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d0,"CPACK_PACKAGING_INSTALL_PREFIX","");
    cVar9 = cmCPackGenerator::GetOption(&local_298->super_cmCPackGenerator,(string *)local_1d0);
    if ((undefined1 *)local_1d0._0_8_ != local_1c0) {
      operator_delete((void *)local_1d0._0_8_,(ulong)(local_1c0._0_8_ + 1));
    }
    if (((cVar9.Value != (string *)0x0) && (1 < (cVar9.Value)->_M_string_length)) &&
       (*((cVar9.Value)->_M_dataplus)._M_p == '/')) {
      std::__cxx11::string::substr((ulong)local_1d0,(ulong)cVar9.Value);
      std::__cxx11::string::_M_append((char *)&local_238,local_1d0._0_8_);
      if ((undefined1 *)local_1d0._0_8_ != local_1c0) {
        operator_delete((void *)local_1d0._0_8_,(ulong)(local_1c0._0_8_ + 1));
      }
      std::__cxx11::string::append((char *)&local_238);
    }
    __rhs = (component->Files).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    local_1f8 = (component->Files).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    bVar4 = __rhs == local_1f8;
    if (!bVar4) {
      do {
        std::operator+(&local_290,&local_238,__rhs);
        if (deduplicator == (Deduplicator *)0x0) {
          DVar5 = Add;
        }
        else {
          DVar5 = Deduplicator::IsDeduplicate(deduplicator,&local_290,&local_258);
        }
        if (deduplicator != (Deduplicator *)0x0 && DVar5 != Add) {
          if (DVar5 != Error) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1d0,"Passing file: ",0xe);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1d0,local_290._M_dataplus._M_p,
                                local_290._M_string_length);
            std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
            pcVar1 = (local_298->super_cmCPackGenerator).Logger;
            std::__cxx11::stringbuf::str();
            _Var3._M_p = local_2b8._M_dataplus._M_p;
            sVar7 = strlen(local_2b8._M_dataplus._M_p);
            cmCPackLog::Log(pcVar1,4,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                            ,0x114,_Var3._M_p,sVar7);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
              operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
            std::ios_base::~ios_base(local_160);
            goto LAB_001e0b2f;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1d0,
                     "ERROR The data in files with the same filename is different.",0x3c);
          pcVar1 = (local_298->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          _Var3._M_p = local_2b8._M_dataplus._M_p;
          sVar7 = strlen(local_2b8._M_dataplus._M_p);
          cmCPackLog::Log(pcVar1,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                          ,0x110,_Var3._M_p,sVar7);
LAB_001e0d9b:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
          std::ios_base::~ios_base(local_160);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p != &local_290.field_2) {
            operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
          }
          break;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"Adding file: ",0xd)
        ;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1d0,local_290._M_dataplus._M_p,
                            local_290._M_string_length);
        std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        pcVar1 = (local_298->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        _Var3._M_p = local_2b8._M_dataplus._M_p;
        sVar7 = strlen(local_2b8._M_dataplus._M_p);
        cmCPackLog::Log(pcVar1,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                        ,0x10b,_Var3._M_p,sVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
        std::ios_base::~ios_base(local_160);
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_218,local_290._M_dataplus._M_p,
                   local_290._M_string_length + local_290._M_dataplus._M_p);
        cmArchiveWrite::Add(local_260,&local_218,0,(char *)0x0,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
LAB_001e0b2f:
        if ((local_260->Error)._M_string_length != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1d0,"ERROR while packaging files: ",0x1d);
          local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
          pcVar2 = (local_260->Error)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2b8,pcVar2,pcVar2 + (local_260->Error)._M_string_length);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1d0,local_2b8._M_dataplus._M_p,
                              local_2b8._M_string_length);
          std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          }
          pcVar1 = (local_298->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          _Var3._M_p = local_2b8._M_dataplus._M_p;
          sVar7 = strlen(local_2b8._M_dataplus._M_p);
          cmCPackLog::Log(pcVar1,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                          ,0x11a,_Var3._M_p,sVar7);
          goto LAB_001e0d9b;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
        }
        __rhs = __rhs + 1;
        bVar4 = __rhs == local_1f8;
      } while (!bVar4);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,
                      CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                               local_238.field_2._M_local_buf[0]) + 1);
    }
    uVar10 = (uint)bVar4;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d0,"Failed to change working directory to ",0x26);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1d0,local_258._M_dataplus._M_p,local_258._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," : ",3);
    __s = strerror(local_58.ResultCode);
    if (__s == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)poVar6->_vptr_basic_ostream[-3]);
    }
    else {
      sVar7 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,__s,sVar7);
    }
    std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    pcVar1 = (local_298->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    _Var3._M_p = local_290._M_dataplus._M_p;
    sVar7 = strlen(local_290._M_dataplus._M_p);
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                    ,0xf4,_Var3._M_p,sVar7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
    std::ios_base::~ios_base(local_160);
    uVar10 = 0;
  }
  cmWorkingDirectory::~cmWorkingDirectory(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  return uVar10;
}

Assistant:

int cmCPackArchiveGenerator::addOneComponentToArchive(
  cmArchiveWrite& archive, cmCPackComponent* component,
  Deduplicator* deduplicator)
{
  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "   - packaging component: " << component->Name << std::endl);
  // Add the files of this component to the archive
  std::string localToplevel(this->GetOption("CPACK_TEMPORARY_DIRECTORY"));
  localToplevel += "/" + component->Name;
  // Change to local toplevel
  cmWorkingDirectory workdir(localToplevel);
  if (workdir.Failed()) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Failed to change working directory to "
                    << localToplevel << " : "
                    << std::strerror(workdir.GetLastResult()) << std::endl);
    return 0;
  }
  std::string filePrefix;
  if (this->IsOn("CPACK_COMPONENT_INCLUDE_TOPLEVEL_DIRECTORY")) {
    filePrefix = cmStrCat(this->GetOption("CPACK_PACKAGE_FILE_NAME"), '/');
  }
  cmValue installPrefix = this->GetOption("CPACK_PACKAGING_INSTALL_PREFIX");
  if (installPrefix && installPrefix->size() > 1 &&
      (*installPrefix)[0] == '/') {
    // add to file prefix and remove the leading '/'
    filePrefix += installPrefix->substr(1);
    filePrefix += "/";
  }
  for (std::string const& file : component->Files) {
    std::string rp = filePrefix + file;

    DeduplicateStatus status = DeduplicateStatus::Add;
    if (deduplicator != nullptr) {
      status = deduplicator->IsDeduplicate(rp, localToplevel);
    }

    if (deduplicator == nullptr || status == DeduplicateStatus::Add) {
      cmCPackLogger(cmCPackLog::LOG_DEBUG, "Adding file: " << rp << std::endl);
      archive.Add(rp, 0, nullptr, false);
    } else if (status == DeduplicateStatus::Error) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "ERROR The data in files with the "
                    "same filename is different.");
      return 0;
    } else {
      cmCPackLogger(cmCPackLog::LOG_DEBUG,
                    "Passing file: " << rp << std::endl);
    }

    if (!archive) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "ERROR while packaging files: " << archive.GetError()
                                                    << std::endl);
      return 0;
    }
  }
  return 1;
}